

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwk.h
# Opt level: O2

void Nwk_ManMarkFanouts_rec(Nwk_Obj_t *pLut,int nLevMax,int nFanMax)

{
  int iVar1;
  long lVar2;
  
  if (((((*(uint *)&pLut->field_0x20 & 7) == 3) &&
       (iVar1 = pLut->pMan->nTravIds, pLut->TravId != iVar1)) &&
      (pLut->TravId = iVar1, pLut->Level <= nLevMax)) && (iVar1 = pLut->nFanouts, iVar1 <= nFanMax))
  {
    for (lVar2 = 0;
        ((int)lVar2 < iVar1 && (pLut->pFanio[pLut->nFanins + lVar2] != (Nwk_Obj_t *)0x0));
        lVar2 = lVar2 + 1) {
      Nwk_ManMarkFanouts_rec(pLut->pFanio[pLut->nFanins + lVar2],nLevMax,nFanMax);
      iVar1 = pLut->nFanouts;
    }
  }
  return;
}

Assistant:

static inline int         Nwk_ObjIsNode( Nwk_Obj_t * p )          { return p->Type == NWK_OBJ_NODE;             }